

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Compiler(Compiler *this,AnnotationFlag annotationFlag)

{
  undefined1 local_28 [28];
  AnnotationFlag annotationFlag_local;
  Compiler *this_local;
  
  local_28._20_4_ = annotationFlag;
  unique0x100000b9 = this;
  SchemaLoader::LazyLoadCallback::LazyLoadCallback(&this->super_LazyLoadCallback);
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_00d93020;
  kj::heap<capnp::compiler::Compiler::Impl,capnp::compiler::Compiler::AnnotationFlag&>
            ((kj *)local_28,(AnnotationFlag *)(local_28 + 0x14));
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>::
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>>
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,decltype(nullptr)>> *)&this->impl
             ,(Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *)local_28);
  kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::~Own
            ((Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *)local_28);
  SchemaLoader::SchemaLoader(&this->loader,&this->super_LazyLoadCallback);
  return;
}

Assistant:

Compiler::Compiler(AnnotationFlag annotationFlag)
    : impl(kj::heap<Impl>(annotationFlag)),
      loader(*this) {}